

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O3

void __thiscall
pow_tests::GetBlockProofEquivalentTime_test::test_method(GetBlockProofEquivalentTime_test *this)

{
  int i;
  void *__s;
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  iterator in_R8;
  iterator in_R9;
  CBlockIndex *from;
  int iVar6;
  FastRandomContext *this_00;
  long lVar7;
  CBlockIndex *to;
  long in_FS_OFFSET;
  undefined4 uVar8;
  undefined4 uVar9;
  const_string file;
  const_string msg;
  long local_128;
  lazy_ostream local_120;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  int64_t tdiff;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  undefined1 local_d0 [16];
  char *local_c0 [2];
  assertion_result local_b0;
  _Base_ptr local_98;
  _Base_ptr p_Stack_90;
  _Base_ptr local_88;
  undefined1 local_78 [24];
  _Base_ptr local_60;
  undefined **local_58;
  _Base_ptr p_Stack_50;
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&chainParams,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  __s = operator_new(0x173180);
  lVar7 = 0;
  memset(__s,0,0x173180);
  do {
    lVar1 = lVar7 * 0x98;
    lVar2 = (long)__s + lVar1 + -0x98;
    if (lVar7 == 0) {
      lVar2 = 0;
    }
    *(long *)((long)__s + lVar1 + 8) = lVar2;
    *(int *)((long)__s + lVar1 + 0x18) = (int)lVar7;
    *(int *)((long)__s + lVar1 + 0x80) =
         *(int *)((long)chainParams._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x100) *
         (int)lVar7 + 0x4ba6a133;
    *(undefined4 *)((long)__s + lVar1 + 0x84) = 0x207fffff;
    if (lVar7 == 0) {
      uVar8 = 0;
      uVar9 = 0;
      local_98 = (_Base_ptr)0x0;
      p_Stack_90 = (_Base_ptr)0x0;
      local_88 = (_Base_ptr)0x0;
    }
    else {
      GetBlockProof((arith_uint256 *)local_78,(CBlockIndex *)((long)__s + lVar1 + -0x98));
      local_48 = *(_Base_ptr *)((long)__s + lVar1 + -0x60);
      p_Stack_40 = *(_Base_ptr *)((long)__s + lVar1 + -0x58);
      local_58 = *(undefined ***)((long)__s + lVar1 + -0x70);
      p_Stack_50 = *(_Base_ptr *)((long)__s + lVar1 + -0x68);
      lVar2 = 0;
      uVar5 = 0;
      do {
        uVar5 = (ulong)*(uint *)(local_78 + lVar2 * 4) +
                *(uint *)((long)&local_58 + lVar2 * 4) + uVar5;
        *(int *)((long)&local_58 + lVar2 * 4) = (int)uVar5;
        uVar5 = uVar5 >> 0x20;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
      uVar8 = SUB84(local_58,0);
      uVar9 = (undefined4)((ulong)local_58 >> 0x20);
      local_98 = p_Stack_50;
      p_Stack_90 = local_48;
      local_88 = p_Stack_40;
    }
    *(ulong *)((long)__s + lVar1 + 0x28) = CONCAT44(uVar9,uVar8);
    *(_Base_ptr *)((long)__s + lVar1 + 0x30) = local_98;
    *(_Base_ptr *)((long)__s + lVar1 + 0x38) = p_Stack_90;
    *(_Base_ptr *)((long)__s + lVar1 + 0x40) = local_88;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar6 = 0;
  do {
    do {
      uVar3 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0xe);
    } while (9999 < uVar3);
    do {
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0xe);
    } while (9999 < uVar4);
    to = (CBlockIndex *)(uVar3 * 0x98 + (long)__s);
    do {
      uVar3 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0xe);
    } while (9999 < uVar3);
    from = (CBlockIndex *)(uVar4 * 0x98 + (long)__s);
    tdiff = GetBlockProofEquivalentTime
                      (to,from,(CBlockIndex *)(uVar3 * 0x98 + (long)__s),
                       (Params *)
                       chainParams._M_t.
                       super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                       .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_e8 = "";
    local_100 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x9b;
    file.m_begin = (iterator)&local_f0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
    local_120.m_empty = false;
    local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = "";
    local_128 = (ulong)to->nTime - (ulong)from->nTime;
    local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(tdiff == local_128);
    local_b0.m_message.px = (element_type *)0x0;
    local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c0[0] = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_c0[1] = "";
    local_d0._8_8_ = &tdiff;
    p_Stack_50 = (_Base_ptr)((ulong)p_Stack_50 & 0xffffffffffffff00);
    local_58 = &PTR__lazy_ostream_013ae428;
    local_48 = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    p_Stack_40 = (_Base_ptr)(local_d0 + 8);
    local_d0._0_8_ = &local_128;
    local_78[8] = 0;
    local_78._0_8_ = &PTR__lazy_ostream_013ae428;
    local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_60 = (_Base_ptr)local_d0;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_b0,&local_120,1,2,REQUIRE,0xec1eed,(size_t)local_c0,0x9b,&local_58,
               "p1->GetBlockTime() - p2->GetBlockTime()",local_78);
    boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 1000);
  operator_delete(__s,0x173180);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams);
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(GetBlockProofEquivalentTime_test)
{
    const auto chainParams = CreateChainParams(*m_node.args, ChainType::MAIN);
    std::vector<CBlockIndex> blocks(10000);
    for (int i = 0; i < 10000; i++) {
        blocks[i].pprev = i ? &blocks[i - 1] : nullptr;
        blocks[i].nHeight = i;
        blocks[i].nTime = 1269211443 + i * chainParams->GetConsensus().nPowTargetSpacing;
        blocks[i].nBits = 0x207fffff; /* target 0x7fffff000... */
        blocks[i].nChainWork = i ? blocks[i - 1].nChainWork + GetBlockProof(blocks[i - 1]) : arith_uint256(0);
    }

    for (int j = 0; j < 1000; j++) {
        CBlockIndex *p1 = &blocks[m_rng.randrange(10000)];
        CBlockIndex *p2 = &blocks[m_rng.randrange(10000)];
        CBlockIndex *p3 = &blocks[m_rng.randrange(10000)];

        int64_t tdiff = GetBlockProofEquivalentTime(*p1, *p2, *p3, chainParams->GetConsensus());
        BOOST_CHECK_EQUAL(tdiff, p1->GetBlockTime() - p2->GetBlockTime());
    }
}